

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameCollaborativeGraphical.cpp
# Opt level: O1

double __thiscall
BayesianGameCollaborativeGraphical::ComputeValueJPol
          (BayesianGameCollaborativeGraphical *this,JointPolicyDiscretePure *jpolBG)

{
  undefined1 auVar1 [16];
  pointer puVar2;
  void *pvVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  undefined4 extraout_var;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  size_type __n;
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [64];
  undefined1 auVar13 [16];
  vector<unsigned_int,_std::allocator<unsigned_int>_> aIs_e;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nrTypes_e;
  vector<unsigned_int,_std::allocator<unsigned_int>_> typeIs_e;
  allocator_type local_d1;
  double local_d0;
  void *local_c8;
  void *local_c0;
  long local_b8;
  double local_b0;
  value_type_conflict1 local_a4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_a0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_88;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_70;
  ulong local_58;
  void *local_50;
  void *local_48;
  ulong local_40;
  ulong local_38;
  
  iVar5 = (*(this->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
            super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
            _vptr_Interface_ProblemToPolicyDiscrete[0x15])();
  local_58 = CONCAT44(extraout_var,iVar5);
  if (local_58 == 0) {
    local_d0 = 0.0;
  }
  else {
    uVar8 = 0;
    local_d0 = 0.0;
    do {
      (*(this->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
        super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
        _vptr_Interface_ProblemToPolicyDiscrete[0x16])(&local_c8,this,uVar8);
      local_50 = local_c0;
      local_48 = local_c8;
      __n = (long)local_c0 - (long)local_c8 >> 2;
      local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = 0;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&local_70,__n,(value_type_conflict1 *)&local_88,(allocator_type *)&local_a0);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&local_88,(long)local_c0 - (long)local_c8 >> 2,(allocator_type *)&local_a0);
      if ((long)local_c0 - (long)local_c8 != 0) {
        puVar2 = (this->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
                 _m_nrTypes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar9 = 0;
        do {
          *(ulong *)(CONCAT44(local_88.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start._4_4_,
                              local_88.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start._0_4_) + uVar9 * 8) =
               (ulong)(uint)puVar2[*(uint *)((long)local_c8 + uVar9 * 4)];
          uVar9 = uVar9 + 1;
        } while ((uVar9 & 0xffffffff) < (ulong)((long)local_c0 - (long)local_c8 >> 2));
      }
      auVar12 = ZEXT864(0) << 0x40;
      local_b0 = 0.0;
      do {
        local_a4 = 0;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  (&local_a0,__n,&local_a4,&local_d1);
        uVar9 = auVar12._0_8_;
        if (local_50 != local_48) {
          uVar7 = 1;
          uVar10 = 0;
          do {
            if ((ulong)((long)local_c0 - (long)local_c8 >> 2) <= uVar10) {
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,uVar10);
            }
            if ((ulong)((long)local_70.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_70.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 2) <= uVar10) {
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,uVar10);
            }
            uVar6 = (*(jpolBG->super_JointPolicyDiscrete).super_JointPolicy._vptr_JointPolicy[0x13])
                              (jpolBG,(ulong)*(uint *)((long)local_c8 + uVar10 * 4),
                               (ulong)local_70.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start[uVar10]);
            uVar9 = auVar12._0_8_;
            local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar10] = uVar6;
            uVar10 = (ulong)uVar7;
            uVar7 = uVar7 + 1;
          } while (uVar10 < __n);
        }
        (*(this->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
          super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
          _vptr_Interface_ProblemToPolicyDiscrete[0x1b])(this,uVar8,&local_70);
        local_38 = uVar9;
        (*(this->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
          super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
          _vptr_Interface_ProblemToPolicyDiscrete[0x20])(this,uVar8,&local_70,&local_a0);
        local_40 = uVar9;
        if (local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_a0.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_a0.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        bVar4 = IndexTools::Increment(&local_70,&local_88);
        auVar11._8_8_ = 0;
        auVar11._0_8_ = local_b0;
        auVar13._8_8_ = 0;
        auVar13._0_8_ = local_40;
        auVar1._8_8_ = 0;
        auVar1._0_8_ = local_38;
        auVar1 = vfmadd231sd_fma(auVar11,auVar13,auVar1);
        auVar12 = ZEXT1664(auVar1);
        local_b0 = auVar1._0_8_;
      } while (!bVar4);
      pvVar3 = (void *)CONCAT44(local_88.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start._4_4_,
                                local_88.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start._0_4_);
      if (pvVar3 != (void *)0x0) {
        operator_delete(pvVar3,(long)local_88.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pvVar3);
      }
      if (local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_70.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_70.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_c8 != (void *)0x0) {
        operator_delete(local_c8,local_b8 - (long)local_c8);
      }
      local_d0 = local_d0 + local_b0;
      uVar8 = (ulong)((int)uVar8 + 1);
    } while (uVar8 < local_58);
  }
  return local_d0;
}

Assistant:

double BayesianGameCollaborativeGraphical::
ComputeValueJPol(
    const JointPolicyDiscretePure & jpolBG
) const
{
    size_t nrR = GetNrLRFs();
    double r = 0.0; //immediate reward (exact)
    for(Index e=0; e < nrR; e++)
    {
        double r_e = 0.0;
        const Scope & agSc = GetScope(e);
        size_t nrAgents_e = agSc.size();
        vector<Index> typeIs_e(nrAgents_e, 0);
        vector<size_t> nrTypes_e(agSc.size());
        IndexTools::RestrictIndividualIndicesToScope(
            GetNrTypes(), agSc, nrTypes_e);

        do{
            //compute the action specified by jpolBG
            vector<Index> aIs_e(nrAgents_e, 0);
            for(Index i=0; i < nrAgents_e; i++)
            {
                Index agI = agSc.at(i);
                Index actionI = jpolBG.GetActionIndex(agI, typeIs_e.at(i));
                aIs_e[i] = actionI;
            }
            double p = GetProbability(e, typeIs_e);
            double this_r =GetUtility(e, typeIs_e, aIs_e);
            r_e += this_r * p;

        }while(!IndexTools::Increment(typeIs_e, nrTypes_e ) );
        r += r_e;

    }
    return r;    
}